

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_api_tests.cpp
# Opt level: O2

void decode_minimalExampleBadChecksum_isUnsuccessful(void)

{
  uint __line;
  char *__assertion;
  string bstr;
  DecodedResult decodedResult;
  string expectedHrp;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bstr,"a1lqfn3q",(allocator<char> *)&decodedResult);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&expectedHrp,"a",(allocator<char> *)&decodedResult);
  bech32::decode(&decodedResult,&bstr);
  if (decodedResult.hrp._M_string_length == 0) {
    if (decodedResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        decodedResult.dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bech32::DecodedResult::~DecodedResult(&decodedResult);
      std::__cxx11::string::~string((string *)&expectedHrp);
      std::__cxx11::string::~string((string *)&bstr);
      return;
    }
    __assertion = "decodedResult.dp.empty()";
    __line = 0x3c;
  }
  else {
    __assertion = "decodedResult.hrp.empty()";
    __line = 0x3b;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_api_tests.cpp"
                ,__line,"void decode_minimalExampleBadChecksum_isUnsuccessful()");
}

Assistant:

void decode_minimalExampleBadChecksum_isUnsuccessful() {
    std::string bstr = "a1lqfn3q"; // last 'q' should be a 'a'
    std::string expectedHrp = "a";

    bech32::DecodedResult decodedResult = bech32::decode(bstr);

    assert(decodedResult.hrp.empty());
    assert(decodedResult.dp.empty());
}